

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__loop_alive(uv_loop_t *loop)

{
  if (((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) &&
     (loop->pending_queue == (void **)loop->pending_queue[0])) {
    return (int)(loop->closing_handles != (uv_handle_t *)0x0);
  }
  return 1;
}

Assistant:

static int uv__loop_alive(const uv_loop_t* loop) {
  return uv__has_active_handles(loop) ||
         uv__has_active_reqs(loop) ||
         !QUEUE_EMPTY(&loop->pending_queue) ||
         loop->closing_handles != NULL;
}